

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

int __thiscall
crnlib::dxt_image::get_block_endpoints
          (dxt_image *this,uint block_x,uint block_y,uint element_index,color_quad_u8 *low_endpoint,
          color_quad_u8 *high_endpoint,bool scaled)

{
  bool bVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  etc1_block *this_00;
  uchar *puVar5;
  uint in_ECX;
  uint *r_00;
  uint in_EDX;
  uint in_ESI;
  dxt_image *in_RDI;
  color_quad<unsigned_char,_int> *in_R8;
  color_quad<unsigned_char,_int> *in_R9;
  int component_1;
  int component;
  uint b;
  uint g;
  uint r;
  etc1_block *src_block;
  uint h;
  uint l;
  undefined1 in_stack_ffffffffffffff7d;
  uint16 in_stack_ffffffffffffff7e;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  undefined1 scaled_00;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined2 in_stack_ffffffffffffffae;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 in_stack_ffffffffffffffb0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  uint local_4;
  
  uVar2 = '\0';
  get_block_endpoints((dxt_image *)(ulong)in_stack_ffffffffffffffc0,
                      (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                      (uint)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4.m_u32,
                      (uint *)CONCAT26(in_stack_ffffffffffffffae,
                                       CONCAT15(in_stack_ffffffffffffffad,
                                                CONCAT14(in_stack_ffffffffffffffac,
                                                         in_stack_ffffffffffffffa8))),
                      (uint *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  uVar4 = (uchar)in_stack_ffffffffffffffa0;
  r_00 = (uint *)(ulong)(in_RDI->m_element_type[in_ECX] - cColorDXT1);
  switch(r_00) {
  case (uint *)0x0:
    dxt1_block::unpack_color
              (r_00,(uint *)in_RDI,
               (uint *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7e,(bool)in_stack_ffffffffffffff7d);
    uVar2 = (uchar)in_stack_ffffffffffffffa8;
    (in_R8->field_0).field_0.r = uVar2;
    uVar3 = (uchar)in_stack_ffffffffffffffa4;
    (in_R8->field_0).field_0.g = uVar3;
    (in_R8->field_0).field_0.b = uVar4;
    dxt1_block::unpack_color
              (r_00,(uint *)in_RDI,
               (uint *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7e,(bool)in_stack_ffffffffffffff7d);
    (in_R9->field_0).field_0.r = uVar2;
    (in_R9->field_0).field_0.g = uVar3;
    (in_R9->field_0).field_0.b = uVar4;
    local_4 = 0xffffffff;
    break;
  case (uint *)0x1:
    local_4 = (uint)in_RDI->m_element_component_index[in_ECX];
    uVar4 = '\0';
    puVar5 = color_quad<unsigned_char,_int>::operator[](in_R8,local_4);
    *puVar5 = uVar4;
    puVar5 = color_quad<unsigned_char,_int>::operator[](in_R9,local_4);
    *puVar5 = uVar2;
    break;
  case (uint *)0x2:
    local_4 = (uint)in_RDI->m_element_component_index[in_ECX];
    uVar4 = '\0';
    puVar5 = color_quad<unsigned_char,_int>::operator[](in_R8,local_4);
    *puVar5 = uVar4;
    puVar5 = color_quad<unsigned_char,_int>::operator[](in_R9,local_4);
    *puVar5 = uVar2;
    break;
  case (uint *)0x3:
    this_00 = (etc1_block *)get_element(in_RDI,in_ESI,in_EDX,in_ECX);
    bVar1 = etc1_block::get_diff_bit(this_00);
    if (bVar1) {
      etc1_block::unpack_color5
                (in_stack_ffffffffffffffae,(bool)in_stack_ffffffffffffffad,in_stack_ffffffffffffffa8
                );
      scaled_00 = (undefined1)(in_stack_ffffffffffffffa8 >> 0x18);
      color_quad<unsigned_char,_int>::operator=
                (in_R8,(color_quad<unsigned_char,_int> *)&stack0xffffffffffffffb4);
      etc1_block::unpack_color5
                ((color_quad_u8 *)
                 CONCAT44(in_stack_ffffffffffffffb4.m_u32,in_stack_ffffffffffffffb0.m_u32),
                 in_stack_ffffffffffffffae,
                 CONCAT11(in_stack_ffffffffffffffad,in_stack_ffffffffffffffac),(bool)scaled_00,
                 in_stack_ffffffffffffffa4);
    }
    else {
      etc1_block::unpack_color4
                (in_stack_ffffffffffffffae,(bool)in_stack_ffffffffffffffad,in_stack_ffffffffffffffa8
                );
      color_quad<unsigned_char,_int>::operator=
                (in_R8,(color_quad<unsigned_char,_int> *)&stack0xffffffffffffffb0);
      etc1_block::unpack_color4
                (in_stack_ffffffffffffffae,(bool)in_stack_ffffffffffffffad,in_stack_ffffffffffffffa8
                );
      color_quad<unsigned_char,_int>::operator=
                (in_R9,(color_quad<unsigned_char,_int> *)&stack0xffffffffffffffac);
    }
    local_4 = 0xffffffff;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int dxt_image::get_block_endpoints(uint block_x, uint block_y, uint element_index, color_quad_u8& low_endpoint, color_quad_u8& high_endpoint, bool scaled) const {
  uint l = 0, h = 0;
  get_block_endpoints(block_x, block_y, element_index, l, h);

  switch (m_element_type[element_index]) {
    case cColorETC1: {
      const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
      if (src_block.get_diff_bit()) {
        low_endpoint = etc1_block::unpack_color5(static_cast<uint16>(l), scaled);
        etc1_block::unpack_color5(high_endpoint, static_cast<uint16>(l), static_cast<uint16>(h), scaled);
      } else {
        low_endpoint = etc1_block::unpack_color4(static_cast<uint16>(l), scaled);
        high_endpoint = etc1_block::unpack_color4(static_cast<uint16>(h), scaled);
      }

      return -1;
    }
    case cColorDXT1: {
      uint r, g, b;

      dxt1_block::unpack_color(r, g, b, static_cast<uint16>(l), scaled);
      low_endpoint.r = static_cast<uint8>(r);
      low_endpoint.g = static_cast<uint8>(g);
      low_endpoint.b = static_cast<uint8>(b);

      dxt1_block::unpack_color(r, g, b, static_cast<uint16>(h), scaled);
      high_endpoint.r = static_cast<uint8>(r);
      high_endpoint.g = static_cast<uint8>(g);
      high_endpoint.b = static_cast<uint8>(b);

      return -1;
    }
    case cAlphaDXT5: {
      const int component = m_element_component_index[element_index];

      low_endpoint[component] = static_cast<uint8>(l);
      high_endpoint[component] = static_cast<uint8>(h);

      return component;
    }
    case cAlphaDXT3: {
      const int component = m_element_component_index[element_index];

      low_endpoint[component] = static_cast<uint8>(l);
      high_endpoint[component] = static_cast<uint8>(h);

      return component;
    }
    default:
      break;
  }

  return 0;
}